

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypedefNameTypeResolver.cpp
# Opt level: O1

Type * __thiscall psy::C::TypedefNameTypeResolver::resolve(TypedefNameTypeResolver *this,Type *ty)

{
  TypeKind TVar1;
  int iVar2;
  int iVar3;
  undefined4 extraout_var;
  TypedefDeclarationSymbol *this_00;
  undefined4 extraout_var_00;
  FunctionType *this_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  Type *pTVar4;
  undefined4 extraout_var_04;
  Compilation *this_02;
  Type *pTVar5;
  long lVar6;
  size_type idx;
  vector<const_psy::C::Type_*,_std::allocator<const_psy::C::Type_*>_> local_48;
  undefined4 extraout_var_01;
  
  while( true ) {
    TVar1 = Type::kind(ty);
    if (TVar1 != TypedefName) {
      switch(TVar1) {
      case Array:
        iVar2 = (*ty->_vptr_Type[3])(ty);
        pTVar5 = ArrayType::elementType((ArrayType *)CONCAT44(extraout_var_00,iVar2));
        pTVar4 = resolve(this,pTVar5);
        if (pTVar4 != pTVar5) {
          ArrayType::resetElementType((ArrayType *)CONCAT44(extraout_var_00,iVar2),pTVar4);
        }
        break;
      case Function:
        iVar2 = (*ty->_vptr_Type[7])(ty);
        this_01 = (FunctionType *)CONCAT44(extraout_var_01,iVar2);
        pTVar5 = FunctionType::returnType(this_01);
        pTVar4 = resolve(this,pTVar5);
        if (pTVar4 != pTVar5) {
          FunctionType::setReturnType(this_01,pTVar4);
        }
        FunctionType::parameterTypes(&local_48,this_01);
        if ((long)local_48.
                  super__Vector_base<const_psy::C::Type_*,_std::allocator<const_psy::C::Type_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)local_48.
                  super__Vector_base<const_psy::C::Type_*,_std::allocator<const_psy::C::Type_*>_>.
                  _M_impl.super__Vector_impl_data._M_start != 0) {
          lVar6 = (long)local_48.
                        super__Vector_base<const_psy::C::Type_*,_std::allocator<const_psy::C::Type_*>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)local_48.
                        super__Vector_base<const_psy::C::Type_*,_std::allocator<const_psy::C::Type_*>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 3;
          idx = 0;
          do {
            pTVar5 = local_48.
                     super__Vector_base<const_psy::C::Type_*,_std::allocator<const_psy::C::Type_*>_>
                     ._M_impl.super__Vector_impl_data._M_start[idx];
            pTVar4 = resolve(this,pTVar5);
            if (pTVar4 != pTVar5) {
              FunctionType::setParameterType(this_01,idx,pTVar4);
            }
            idx = idx + 1;
          } while (lVar6 + (ulong)(lVar6 == 0) != idx);
        }
        if (local_48.super__Vector_base<const_psy::C::Type_*,_std::allocator<const_psy::C::Type_*>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_48.
                          super__Vector_base<const_psy::C::Type_*,_std::allocator<const_psy::C::Type_*>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_48.
                                super__Vector_base<const_psy::C::Type_*,_std::allocator<const_psy::C::Type_*>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_48.
                                super__Vector_base<const_psy::C::Type_*,_std::allocator<const_psy::C::Type_*>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        break;
      case Pointer:
        iVar2 = (*ty->_vptr_Type[9])(ty);
        pTVar5 = PointerType::referencedType((PointerType *)CONCAT44(extraout_var_02,iVar2));
        pTVar4 = resolve(this,pTVar5);
        if (pTVar4 != pTVar5) {
          PointerType::resetReferencedType((PointerType *)CONCAT44(extraout_var_02,iVar2),pTVar4);
        }
        break;
      case Qualified:
        iVar2 = (*ty->_vptr_Type[0x11])(ty);
        pTVar5 = QualifiedType::unqualifiedType((QualifiedType *)CONCAT44(extraout_var_03,iVar2));
        pTVar4 = resolve(this,pTVar5);
        if (pTVar4 != pTVar5) {
          TVar1 = Type::kind(pTVar4);
          if (TVar1 == Qualified) {
            iVar3 = (*pTVar4->_vptr_Type[0x11])(pTVar4);
            pTVar4 = QualifiedType::unqualifiedType
                               ((QualifiedType *)CONCAT44(extraout_var_04,iVar3));
          }
          QualifiedType::resetUnqualifiedType
                    ((QualifiedType *)CONCAT44(extraout_var_03,iVar2),pTVar4);
        }
      }
      return ty;
    }
    iVar2 = (*ty->_vptr_Type[0xb])(ty);
    this_00 = TypedefNameType::declaration((TypedefNameType *)CONCAT44(extraout_var,iVar2));
    if (this_00 == (TypedefDeclarationSymbol *)0x0) break;
    ty = TypedefDeclarationSymbol::synonymizedType(this_00);
  }
  this_02 = SemanticModel::compilation(this->semaModel_);
  pTVar5 = &Compilation::canonicalErrorType(this_02)->super_Type;
  return pTVar5;
}

Assistant:

const Type* TypedefNameTypeResolver::resolve(const Type* ty)
{
    switch (ty->kind()) {
        case TypeKind::Basic:
        case TypeKind::Void:
        case TypeKind::Tag:
        case TypeKind::Error:
            break;

        case TypeKind::Array: {
            auto arrTy = ty->asArrayType();
            auto elemTy = arrTy->elementType();
            auto resolvedTy = resolve(elemTy);
            if (resolvedTy != elemTy)
                arrTy->resetElementType(resolvedTy);
            break;
        }

        case TypeKind::Function: {
            auto funcTy = ty->asFunctionType();
            auto retTy = funcTy->returnType();
            auto resolvedTy = resolve(retTy);
            if (resolvedTy != retTy)
                funcTy->setReturnType(resolvedTy);
            const auto parms = funcTy->parameterTypes();
            const auto parmsSize = parms.size();
            for (FunctionType::ParameterTypes::size_type idx = 0; idx < parmsSize; ++idx) {
                const Type* parmTy = parms[idx];
                resolvedTy = resolve(parmTy);
                if (resolvedTy != parmTy)
                    funcTy->setParameterType(idx, resolvedTy);
            }
            break;
        }

        case TypeKind::Pointer: {
            auto ptrTy = ty->asPointerType();
            auto refedTy = ptrTy->referencedType();
            auto resolvedTy = resolve(refedTy);
            if (resolvedTy != refedTy)
                ptrTy->resetReferencedType(resolvedTy);
            break;
        }

        case TypeKind::TypedefName: {
            auto tydefNameTy = ty->asTypedefNameType();
            auto tydefDecl = tydefNameTy->declaration();
            if (!tydefDecl)
                return semaModel_->compilation()->canonicalErrorType();
            return resolve(tydefDecl->synonymizedType());
        }

        case TypeKind::Qualified: {
            auto qualTy = ty->asQualifiedType();
            auto unqualTy = qualTy->unqualifiedType();
            auto resolvedTy = resolve(unqualTy);
            if (resolvedTy != unqualTy) {
                qualTy->resetUnqualifiedType(
                        resolvedTy->kind() == TypeKind::Qualified
                            ? resolvedTy->asQualifiedType()->unqualifiedType()
                            : resolvedTy);
            }
            break;
        }
    }

    return ty;
}